

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic-tests.cpp
# Opt level: O3

void DumpToFile(bool *result)

{
  uint uVar1;
  TestClass2 *this;
  undefined8 uVar2;
  int iVar3;
  undefined8 uVar4;
  uint64_t memLeakSize;
  size_t memLeakCount;
  uint64_t uStack_28;
  size_t local_20;
  
  __start(true,"dumptofile_test.log",false);
  iVar3 = 10;
  do {
    this = (TestClass2 *)operator_new(0x30);
    TestClass2::TestClass2(this);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  __mem_leak_check(&local_20,&uStack_28,true,"dumptofile_memleakcheck.log",false);
  __stop_and_free_all_mem();
  iVar3 = countLinesInFile("dumptofile_test.log");
  if (iVar3 == 0x3e) {
    iVar3 = countLinesInFile("dumptofile_memleakcheck.log");
    if (iVar3 == 0x1f) {
      return;
    }
    uVar1 = countLinesInFile("dumptofile_memleakcheck.log");
    uVar2 = 0x8f;
    uVar4 = 0x1f;
  }
  else {
    uVar1 = countLinesInFile("dumptofile_test.log");
    uVar2 = 0x8e;
    uVar4 = 0x3e;
  }
  printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n","DumpToFile",uVar2,
         (ulong)uVar1,uVar4);
  *result = false;
  return;
}

Assistant:

TEST_CASE(DumpToFile) {

    START_TEST_DUMP_TO_FILE("dumptofile_test.log", false);

    TestClass1* arr1 = new TestClass1[100];

    TestClass1* testArray1[10];
    TestClass2* testArray2[10];

    for (int i = 0; i < 10; i++) {
        testArray1[i] = new TestClass1();
        testArray2[i] = new TestClass2();
    }

    MemPlumber::memLeakCheck(memLeakCount, memLeakSize, true, "dumptofile_memleakcheck.log", false);

    STOP_TEST;

    #if !defined _MSC_VER || !defined _DEBUG
    TEST_ASSERT_EQUAL(countLinesInFile("dumptofile_test.log"), 62);
    TEST_ASSERT_EQUAL(countLinesInFile("dumptofile_memleakcheck.log"), 31);
    #else
    TEST_ASSERT_EQUAL(countLinesInFile("dumptofile_test.log"), 82);
    TEST_ASSERT_EQUAL(countLinesInFile("dumptofile_memleakcheck.log"), 41);
    #endif
}